

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O0

void __thiscall OpenMD::NPTf::evolveEtaB(NPTf *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  long in_RDI;
  int j;
  int i;
  undefined4 local_10;
  undefined4 local_c;
  
  for (local_c = 0; (int)local_c < 3; local_c = local_c + 1) {
    for (local_10 = 0; (int)local_10 < 3; local_10 = local_10 + 1) {
      pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),local_c,local_10);
      dVar1 = *pdVar8;
      pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                         ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x298),local_c,local_10);
      *pdVar8 = dVar1;
    }
  }
  for (local_c = 0; (int)local_c < 3; local_c = local_c + 1) {
    for (local_10 = 0; (int)local_10 < 3; local_10 = local_10 + 1) {
      if (local_c == local_10) {
        pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x250),local_c,local_10);
        dVar1 = *pdVar8;
        dVar2 = *(double *)(in_RDI + 0x10);
        dVar3 = *(double *)(in_RDI + 0x128);
        pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x1b0),local_c,local_10);
        dVar4 = *pdVar8;
        dVar5 = *(double *)(in_RDI + 0x138);
        dVar6 = *(double *)(in_RDI + 0xf8);
        dVar7 = *(double *)(in_RDI + 0x110);
        pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),local_c,local_10);
        *pdVar8 = dVar1 + (dVar2 * dVar3 * (dVar4 - dVar5 / 163882576.0)) / (dVar6 * dVar7);
      }
      else {
        pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x250),local_c,local_10);
        dVar1 = *pdVar8;
        dVar2 = *(double *)(in_RDI + 0x10);
        dVar3 = *(double *)(in_RDI + 0x128);
        pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x1b0),local_c,local_10);
        dVar4 = *pdVar8;
        dVar5 = *(double *)(in_RDI + 0xf8);
        dVar6 = *(double *)(in_RDI + 0x110);
        pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                           ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),local_c,local_10);
        *pdVar8 = dVar1 + (dVar2 * dVar3 * dVar4) / (dVar5 * dVar6);
      }
    }
  }
  return;
}

Assistant:

void NPTf::evolveEtaB() {
    int i;
    int j;

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        prevEta(i, j) = eta(i, j);
      }
    }

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        if (i == j) {
          eta(i, j) =
              oldEta(i, j) +
              dt2 * instaVol *
                  (press(i, j) - targetPressure / Constants::pressureConvert) /
                  (NkBT * tb2);
        } else {
          eta(i, j) =
              oldEta(i, j) + dt2 * instaVol * press(i, j) / (NkBT * tb2);
        }
      }
    }
  }